

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_mod.c
# Opt level: O3

int BN_mod_lshift_quick(BIGNUM *r,BIGNUM *a,int n,BIGNUM *m)

{
  int iVar1;
  int iVar2;
  BIGNUM *pBVar3;
  uint n_00;
  
  if ((r != a) && (pBVar3 = BN_copy(r,a), pBVar3 == (BIGNUM *)0x0)) {
    return 0;
  }
  if (0 < n) {
    do {
      iVar1 = BN_num_bits(m);
      iVar2 = BN_num_bits(r);
      n_00 = iVar1 - iVar2;
      if ((int)n_00 < 0) {
        return 0;
      }
      if ((uint)n <= n_00) {
        n_00 = n;
      }
      if (iVar1 == iVar2) {
        iVar1 = BN_lshift1(r,r);
        if (iVar1 == 0) {
          return 0;
        }
        n = n - 1;
      }
      else {
        iVar1 = BN_lshift(r,r,n_00);
        if (iVar1 == 0) {
          return 0;
        }
        n = n - n_00;
      }
      iVar1 = BN_cmp(r,m);
      if ((-1 < iVar1) && (iVar1 = BN_sub(r,r,m), iVar1 == 0)) {
        return 0;
      }
    } while (0 < n);
  }
  return 1;
}

Assistant:

int BN_mod_lshift_quick(BIGNUM *r, const BIGNUM *a, int n, const BIGNUM *m)
{
    if (r != a) {
        if (BN_copy(r, a) == NULL)
            return 0;
    }

    while (n > 0) {
        int max_shift;

        /* 0 < r < m */
        max_shift = BN_num_bits(m) - BN_num_bits(r);
        /* max_shift >= 0 */

        if (max_shift < 0) {
            //BNerr(BN_F_BN_MOD_LSHIFT_QUICK, BN_R_INPUT_NOT_REDUCED);
            return 0;
        }

        if (max_shift > n)
            max_shift = n;

        if (max_shift) {
            if (!BN_lshift(r, r, max_shift))
                return 0;
            n -= max_shift;
        } else {
            if (!BN_lshift1(r, r))
                return 0;
            --n;
        }

        /* BN_num_bits(r) <= BN_num_bits(m) */

        if (BN_cmp(r, m) >= 0) {
            if (!BN_sub(r, r, m))
                return 0;
        }
    }
    bn_check_top(r);

    return 1;
}